

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

AggregateFunction *
duckdb::ScalarDiscreteQuantile::GetFunction<duckdb::interval_t,duckdb::QuantileStandardType>
          (LogicalType *type)

{
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  AggregateFunction *fun;
  AggregateFunction *this;
  AggregateFunction *input_type;
  
  this = in_RDI;
  input_type = in_RDI;
  LogicalType::LogicalType((LogicalType *)in_RDI,(LogicalType *)in_RDI);
  LogicalType::LogicalType((LogicalType *)this,(LogicalType *)in_RDI);
  AggregateFunction::
  UnaryAggregateDestructor<duckdb::QuantileState<duckdb::interval_t,duckdb::QuantileStandardType>,duckdb::interval_t,duckdb::interval_t,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>,(duckdb::AggregateDestructorType)1>
            ((LogicalType *)input_type,in_RSI);
  LogicalType::~LogicalType((LogicalType *)0x1cec70e);
  LogicalType::~LogicalType((LogicalType *)0x1cec718);
  in_RDI->window =
       QuantileScalarOperation<true,duckdb::QuantileStandardType>::
       Window<duckdb::QuantileState<duckdb::interval_t,duckdb::QuantileStandardType>,duckdb::interval_t,duckdb::interval_t>
  ;
  in_RDI->window_init =
       QuantileOperation::
       WindowInit<duckdb::QuantileState<duckdb::interval_t,duckdb::QuantileStandardType>,duckdb::interval_t>
  ;
  return this;
}

Assistant:

static AggregateFunction GetFunction(const LogicalType &type) {
		using STATE = QuantileState<INPUT_TYPE, TYPE_OP>;
		using OP = QuantileScalarOperation<true>;
		auto fun = AggregateFunction::UnaryAggregateDestructor<STATE, INPUT_TYPE, INPUT_TYPE, OP,
		                                                       AggregateDestructorType::LEGACY>(type, type);
#ifndef DUCKDB_SMALLER_BINARY
		fun.window = OP::Window<STATE, INPUT_TYPE, INPUT_TYPE>;
		fun.window_init = OP::WindowInit<STATE, INPUT_TYPE>;
#endif
		return fun;
	}